

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renumberCursorsCb(Walker *pWalker,Expr *pExpr)

{
  char *in_RSI;
  Walker *in_RDI;
  int op;
  
  if ((*in_RSI == -0x58) || (*in_RSI == -0x4d)) {
    renumberCursorDoMapping(in_RDI,(int *)(in_RSI + 0x2c));
  }
  if ((*(uint *)(in_RSI + 4) & 1) != 0) {
    renumberCursorDoMapping(in_RDI,(int *)(in_RSI + 0x34));
  }
  return 0;
}

Assistant:

static int renumberCursorsCb(Walker *pWalker, Expr *pExpr){
  int op = pExpr->op;
  if( op==TK_COLUMN || op==TK_IF_NULL_ROW ){
    renumberCursorDoMapping(pWalker, &pExpr->iTable);
  }
  if( ExprHasProperty(pExpr, EP_OuterON) ){
    renumberCursorDoMapping(pWalker, &pExpr->w.iJoin);
  }
  return WRC_Continue;
}